

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_ffi.c
# Opt level: O1

int ffi_index_meta(lua_State *L,CTState *cts,CType *ct,MMS mm)

{
  TValue *pTVar1;
  int iVar2;
  cTValue *pcVar3;
  TValue *pTVar4;
  GCstr *pGVar5;
  ulong uVar6;
  GCstr *pGVar7;
  ulong uVar8;
  CTypeID id;
  ErrMsg em;
  
  id = (int)((ulong)((long)ct - (long)cts->tab) >> 3) * -0x55555555;
  pcVar3 = lj_ctype_meta(cts,id,mm);
  if (pcVar3 != (cTValue *)0x0) {
    if ((pcVar3->field_4).it >> 0xf == 0x1fff7) goto LAB_001333c0;
    pTVar1 = L->base;
    if (mm == MM_index) {
      pcVar3 = lj_meta_tget(L,pcVar3,pTVar1 + 1);
      if (pcVar3 == (cTValue *)0x0) {
        iVar2 = 0;
      }
      else if (pcVar3->u64 == 0xffffffffffffffff) {
        iVar2 = 2;
      }
      else {
        L->top[-1] = (TValue)pcVar3->u64;
        iVar2 = 1;
      }
      if (iVar2 != 0) {
        if (iVar2 != 2) {
          return 1;
        }
        goto LAB_001333d2;
      }
    }
    else {
      pTVar4 = lj_meta_tset(L,pcVar3,pTVar1 + 1);
      if (pTVar4 != (TValue *)0x0) {
        *pTVar4 = pTVar1[2];
        return 0;
      }
    }
    *pTVar1 = *L->top;
    pcVar3 = L->top + -2;
LAB_001333c0:
    iVar2 = lj_meta_tailcall(L,pcVar3);
    return iVar2;
  }
LAB_001333d2:
  pGVar5 = lj_ctype_repr(L,id,(GCstr *)0x0);
  uVar8 = L->base[1].u64;
  uVar6 = (long)uVar8 >> 0x2f;
  if (uVar6 == 0xfffffffffffffff5) {
    pGVar7 = lj_ctype_repr(L,(uint)*(ushort *)((uVar8 & 0x7fffffffffff) + 10),(GCstr *)0x0);
    pGVar7 = pGVar7 + 1;
  }
  else {
    if (uVar6 == 0xfffffffffffffffb) {
      pGVar7 = (GCstr *)((uVar8 & 0x7fffffffffff) + 0x18);
      em = LJ_ERR_FFI_BADMEMBER;
      goto LAB_00133462;
    }
    uVar8 = 0xd;
    if (0xfffffffffffffff2 < uVar6) {
      uVar8 = ~uVar6;
    }
    pGVar7 = (GCstr *)lj_obj_itypename[uVar8];
  }
  em = LJ_ERR_FFI_BADIDXW;
LAB_00133462:
  lj_err_callerv(L,em,pGVar5 + 1,pGVar7);
}

Assistant:

static int ffi_index_meta(lua_State *L, CTState *cts, CType *ct, MMS mm)
{
  CTypeID id = ctype_typeid(cts, ct);
  cTValue *tv = lj_ctype_meta(cts, id, mm);
  TValue *base = L->base;
  if (!tv) {
    const char *s;
  err_index:
    s = strdata(lj_ctype_repr(L, id, NULL));
    if (tvisstr(L->base+1)) {
      lj_err_callerv(L, LJ_ERR_FFI_BADMEMBER, s, strVdata(L->base+1));
    } else {
      const char *key = tviscdata(L->base+1) ?
	strdata(lj_ctype_repr(L, cdataV(L->base+1)->ctypeid, NULL)) :
	lj_typename(L->base+1);
      lj_err_callerv(L, LJ_ERR_FFI_BADIDXW, s, key);
    }
  }
  if (!tvisfunc(tv)) {
    if (mm == MM_index) {
      cTValue *o = lj_meta_tget(L, tv, base+1);
      if (o) {
	if (tvisnil(o)) goto err_index;
	copyTV(L, L->top-1, o);
	return 1;
      }
    } else {
      TValue *o = lj_meta_tset(L, tv, base+1);
      if (o) {
	copyTV(L, o, base+2);
	return 0;
      }
    }
    copyTV(L, base, L->top);
    tv = L->top-1-LJ_FR2;
  }
  return lj_meta_tailcall(L, tv);
}